

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

_Bool get_long_from_string(char *s,long *val)

{
  _Bool _Var1;
  long lVar2;
  char *endptr;
  char *local_20;
  
  lVar2 = strtol(s,&local_20,10);
  if (*s == '\0') {
LAB_001356b6:
    _Var1 = false;
  }
  else {
    if (*local_20 == '\0') {
      if (lVar2 + 0x8000000000000001U < 2) goto LAB_001356b6;
    }
    else {
      _Var1 = contains_only_spaces(local_20);
      if (!_Var1 || 0xfffffffffffffffd < lVar2 + 0x7fffffffffffffffU) goto LAB_001356b6;
    }
    *val = lVar2;
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

static bool get_long_from_string(const char *s, long *val)
{
	char *endptr;
	long lval = strtol(s, &endptr, 10);

	/*
	 * Reject LONG_MIN and LONG_MAX so it isn't necessary to check errno
	 * to see if the value in the string was out of range.
	 */
	if (s[0] == '\0' ||
			(*endptr != '\0' && !contains_only_spaces(endptr)) ||
			lval <= LONG_MIN || lval >= LONG_MAX) {
		return false;
	}
	*val = lval;
	return true;
}